

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

int IDisk::AddByteToTrack(uchar *track,uint index,uchar byte,int size,uchar previous_bit)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  
  if (track != (uchar *)0x0) {
    if (index != 0) {
      previous_bit = track[index - 1];
    }
    if (0 < size) {
      iVar2 = 7;
      bVar3 = previous_bit == '\0';
      do {
        uVar4 = 1 << ((byte)iVar2 & 0x1f);
        bVar5 = (uVar4 & byte) == 0;
        track[index] = bVar3 & bVar5;
        track[index + 1] = (uVar4 & byte) != 0;
        index = index + 2;
        iVar1 = size + iVar2;
        iVar2 = iVar2 + -1;
        bVar3 = bVar5;
      } while (iVar1 != 8);
    }
    return index;
  }
  return index + size * 2;
}

Assistant:

int IDisk::AddByteToTrack(unsigned char* track, unsigned int index, unsigned char byte, int size,
                          unsigned char previous_bit)
{
   if (track == nullptr)
      return index + (size * 2);

   if (index > 0)
   {
      previous_bit = track[index - 1];
   }

   for (int i = 0; i < size; i++)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - i)) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         track[index] = 0;
      }

      previous_bit = track[index++];
   }
   return index;
}